

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::PlyParser::parseElementDescr
          (PlyParser *this,stringstream *cin,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *header)

{
  _List_node_base *p_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *this_00;
  Type TVar4;
  size_t num;
  string tag;
  string name;
  string name_1;
  Element elt;
  stringstream line;
  
  elt.name._M_dataplus._M_p = (pointer)&elt.name.field_2;
  elt.name._M_string_length = 0;
  elt.name.field_2._M_local_buf[0] = '\0';
  elt.properties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elt.properties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elt.properties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  elt.type._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &elt.type._M_t._M_impl.super__Rb_tree_header._M_header;
  elt.type._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  elt.type._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  elt.type._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  elt.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &elt.data._M_t._M_impl.super__Rb_tree_header._M_header;
  elt.data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  elt.data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  elt.data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  elt.list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &elt.list._M_t._M_impl.super__Rb_tree_header._M_header;
  elt.list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  elt.list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  elt.list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  elt.type._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       elt.type._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  elt.data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       elt.data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  elt.list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       elt.list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator>>((istream *)cin,(string *)&name);
  std::istream::_M_extract<unsigned_long>((ulong *)cin);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->mesh).order,&name);
  std::__cxx11::string::_M_assign((string *)&elt);
  do {
    p_Var1 = (header->
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)header) {
LAB_0018ea75:
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Element>_>_>
                ::operator[](&(this->mesh).elements,&name);
      Element::operator=(this_00,&elt);
      std::__cxx11::string::~string((string *)&name);
      Element::~Element(&elt);
      return;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&line,(string *)(p_Var1 + 1),_S_out|_S_in);
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    tag._M_string_length = 0;
    tag.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&line,(string *)&tag);
    bVar2 = std::operator!=(&tag,"property");
    if (bVar2) {
      std::__cxx11::string::~string((string *)&tag);
      std::__cxx11::stringstream::~stringstream((stringstream *)&line);
      goto LAB_0018ea75;
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(header);
    TVar4 = parseType(this,&line);
    name_1._M_dataplus._M_p = (pointer)&name_1.field_2;
    name_1._M_string_length = 0;
    name_1.field_2._M_local_buf[0] = '\0';
    std::operator>>((istream *)&line,(string *)&name_1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::SceneGraph::Type>_>_>
             ::operator[](&elt.type,&name_1);
    pmVar3->ty = TVar4.ty;
    pmVar3->index = TVar4.index;
    pmVar3->data = TVar4.data;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&elt.properties,&name_1);
    std::__cxx11::string::~string((string *)&name_1);
    std::__cxx11::string::~string((string *)&tag);
    std::__cxx11::stringstream::~stringstream((stringstream *)&line);
  } while( true );
}

Assistant:

Type parseType(std::stringstream& cin) 
      {
        std::string ty; cin >> ty;
        if (ty == "list") {
          std::string ty0; cin >> ty0;
          std::string ty1; cin >> ty1;
          return Type(Type::PTY_LIST,typeTagOfString(ty0),typeTagOfString(ty1));
        } else return Type(typeTagOfString(ty));
      }